

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BoxCoordinatesMode::MergePartialFromCodedStream
          (BoxCoordinatesMode *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint tag;
  ulong uVar5;
  
LAB_003b53a5:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b53c8;
      input->buffer_ = pbVar2 + 1;
      uVar5 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b53c8:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar5 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar5 = 0x100000000;
      }
      uVar5 = uVar4 | uVar5;
    }
    tag = (uint)uVar5;
    if (((uVar5 & 0x100000000) != 0) && ((char)uVar5 == '\b' && (tag & 0xfffffff8) == 8)) {
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar5 = (ulong)bVar1;
        uVar4 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b543b;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar4 = 0;
LAB_003b543b:
        uVar5 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      this->boxmode_ = (int)uVar5;
      goto LAB_003b53a5;
    }
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool BoxCoordinatesMode::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BoxCoordinatesMode)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.BoxCoordinatesMode.Coordinates boxMode = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_boxmode(static_cast< ::CoreML::Specification::BoxCoordinatesMode_Coordinates >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BoxCoordinatesMode)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BoxCoordinatesMode)
  return false;
#undef DO_
}